

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O2

void __thiscall duckdb_re2::RegexpStatus::~RegexpStatus(RegexpStatus *this)

{
  string *this_00;
  
  this_00 = this->tmp_;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

~RegexpStatus() { delete tmp_; }